

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType::mutable_imagesizerange(ImageFeatureType *this)

{
  ImageFeatureType_ImageSizeRange *pIVar1;
  ImageFeatureType_ImageSizeRange *_msg;
  ImageFeatureType *this_local;
  
  pIVar1 = _internal_mutable_imagesizerange(this);
  return pIVar1;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_ImageSizeRange* ImageFeatureType::mutable_imagesizerange() {
  ::CoreML::Specification::ImageFeatureType_ImageSizeRange* _msg = _internal_mutable_imagesizerange();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.imageSizeRange)
  return _msg;
}